

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

int __thiscall Socket::bind(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  undefined1 local_18 [8];
  sockaddr_in saddr;
  
  local_18._0_2_ = 2;
  local_18._4_4_ =
       (uint)__fd >> 0x18 | (__fd & 0xff0000U) >> 8 | (__fd & 0xff00U) << 8 | __fd << 0x18;
  local_18._2_2_ = (ushort)__addr << 8 | (ushort)__addr >> 8;
  iVar1 = ::bind(this->_fd,(sockaddr *)local_18,0x10);
  return CONCAT31((int3)((uint)iVar1 >> 8),iVar1 != -1);
}

Assistant:

bool Socket::bind( uint32_t ipaddr, uint16_t port )
{
    struct sockaddr_in saddr;
    saddr.sin_family = AF_INET;
    saddr.sin_addr.s_addr = htonl(ipaddr);
    saddr.sin_port = htons(port);
    if(::bind(_fd, (const struct sockaddr *)&saddr, sizeof(saddr)) == SOCKET_ERROR)
        return false;
    return true;
}